

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::dotSI16x8toI32x4(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  uintptr_t uVar1;
  Literal *val;
  long lVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  Type *this_00;
  undefined1 local_238 [8];
  LaneArray<4UL_*_2UL> lhs;
  LaneArray<4UL_*_2UL> rhs;
  LaneArray<4UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  undefined8 local_38;
  
  getLanes<short,8>((LaneArray<8> *)local_238,(wasm *)this,other);
  getLanes<short,8>((LaneArray<8> *)&lhs._M_elems[7].type,(wasm *)other,val);
  result._M_elems[3].field_0.i64 = 0;
  result._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].type.id = 0;
  result._M_elems[1].type.id = 0;
  result._M_elems[2].field_0.i64 = 0;
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  rhs._M_elems[7].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  puVar3 = rhs._M_elems[0].field_0.v128 + 8;
  puVar4 = lhs._M_elems[0].field_0.v128 + 8;
  uVar1 = 0;
  do {
    local_48.i32 = 0;
    local_38 = 2;
    this_00 = &result._M_elems[uVar1 - 1].type;
    result._M_elems[3].type.id = uVar1;
    if ((anon_union_16_6_1532cd5a_for_Literal_0 *)this_00 != &local_48) {
      ~Literal((Literal *)this_00);
      Literal((Literal *)this_00,(Literal *)&local_48.func);
    }
    ~Literal((Literal *)&local_48.func);
    lVar2 = 0;
    do {
      if (((result._M_elems[uVar1].field_0.func.super_IString.str._M_str != (char *)0x2) ||
          (*(long *)(puVar4 + lVar2) != 2)) || (*(long *)(puVar3 + lVar2) != 2)) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      local_48.i32 = *(int *)(puVar3 + lVar2 + -0x10) * *(int *)(puVar4 + lVar2 + -0x10) +
                     (int)this_00->id;
      local_38 = 2;
      if ((anon_union_16_6_1532cd5a_for_Literal_0 *)this_00 != &local_48) {
        ~Literal((Literal *)this_00);
        Literal((Literal *)this_00,(Literal *)&local_48.func);
      }
      ~Literal((Literal *)&local_48.func);
      lVar2 = lVar2 + 0x18;
    } while (lVar2 == 0x18);
    uVar1 = result._M_elems[3].type.id + 1;
    puVar3 = puVar3 + 0x30;
    puVar4 = puVar4 + 0x30;
    if (uVar1 == 4) {
      Literal(__return_storage_ptr__,(LaneArray<4> *)&rhs._M_elems[7].type);
      lVar2 = 0x48;
      do {
        ~Literal((Literal *)((long)result._M_elems + lVar2 + -8));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      lVar2 = 0xa8;
      do {
        ~Literal((Literal *)((long)rhs._M_elems + lVar2 + -8));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      lVar2 = 0xa8;
      do {
        ~Literal((Literal *)(local_238 + lVar2));
        lVar2 = lVar2 + -0x18;
      } while (lVar2 != -0x18);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Literal Literal::dotSI16x8toI32x4(const Literal& other) const {
  return dot<4, 2, &Literal::getLanesSI16x8>(*this, other);
}